

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mouse.cpp
# Opt level: O1

void __thiscall Mouse::TrimBuffer(Mouse *this)

{
  _Map_pointer ppEVar1;
  
  while (ppEVar1 = (this->buffer).c.super__Deque_base<Mouse::Event,_std::allocator<Mouse::Event>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node,
        4 < ((long)(this->buffer).c.super__Deque_base<Mouse::Event,_std::allocator<Mouse::Event>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last -
             (long)(this->buffer).c.super__Deque_base<Mouse::Event,_std::allocator<Mouse::Event>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
            ((long)(this->buffer).c.super__Deque_base<Mouse::Event,_std::allocator<Mouse::Event>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this->buffer).c.super__Deque_base<Mouse::Event,_std::allocator<Mouse::Event>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
            ((((ulong)((long)ppEVar1 -
                      (long)(this->buffer).c.
                            super__Deque_base<Mouse::Event,_std::allocator<Mouse::Event>_>._M_impl.
                            super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(ppEVar1 == (_Map_pointer)0x0)) * 0x20) {
    std::deque<Mouse::Event,_std::allocator<Mouse::Event>_>::pop_front(&(this->buffer).c);
  }
  return;
}

Assistant:

void Mouse::TrimBuffer()
{
	while( buffer.size() > bufferSize )
	{
		buffer.pop();
	}
}